

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Appearance_PDU::SetAppearanceEM(Appearance_PDU *this,EntityAppearance *EM)

{
  KUINT16 *pKVar1;
  
  if (((this->m_AppearanceFlag2Union).m_ui8Flag & 1) == 0) {
    (this->m_AppearanceFlag2Union).m_ui8Flag = (this->m_AppearanceFlag2Union).m_ui8Flag | 1;
    if (-1 < (char)(this->m_AppearanceFlag1Union).m_ui8Flag) {
      (this->m_AppearanceFlag1Union).m_ui8Flag = (this->m_AppearanceFlag1Union).m_ui8Flag | 0x80;
      pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
      *pKVar1 = *pKVar1 + 1;
    }
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 4;
  }
  (this->m_EMApp).m_Appearance = EM->m_Appearance;
  return;
}

Assistant:

void Appearance_PDU::SetAppearanceEMFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag2Union.m_ui8EM )return;

    m_AppearanceFlag2Union.m_ui8EM = F;

    if( F )
    {
        SetFlag2Flag( F );
        m_ui16PDULength += EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
}